

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseSession.cpp
# Opt level: O3

void __thiscall
tonk::ApplicationSession::onP2PStartConnect
          (ApplicationSession *this,uint16_t myRendezvousVisibleSourcePort,
          uint32_t rendezvousServerConnectionId,P2PConnectParams *startParams)

{
  atomic<int> *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  key_t key;
  OutputWorker *pOVar3;
  IConnection *pIVar4;
  Connection *this_00;
  uint uVar5;
  uint64_t value;
  char *pcVar6;
  bool bVar7;
  Result result;
  undefined1 local_218 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  char local_1e8 [16];
  address local_1d8;
  undefined1 local_1b8 [16];
  RefCounter *local_1a8;
  ConnectionIdMap *local_1a0;
  ConnectionAddrMap *local_198;
  ConnectionIdMap *local_190;
  P2PConnectionKeyMap *local_188;
  MappedPortLifetime *pMStack_180;
  element_type *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  undefined1 local_168 [16];
  undefined4 local_158;
  undefined8 local_150;
  ios_base local_138 [264];
  
  if (((this->SelfRefCount).Shutdown._M_base._M_i & 1U) == 0) {
    key = (key_t)(startParams->EncryptionKey >> 0x20);
    if (startParams->WinTies != false) {
      key = (key_t)startParams->EncryptionKey;
    }
    pIVar4 = P2PConnectionKeyMap::FindByKey(&this->P2PKeyMap,key);
    if (pIVar4 != (IConnection *)0x0) {
      if ((int)(this->Logger).ChannelMinLevel < 4) {
        local_1b8._0_8_ = (this->Logger).ChannelName;
        local_1b8._8_4_ = Warning;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,(this->Logger).Prefix._M_dataplus._M_p,
                   (this->Logger).Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   "Ignoring simultaneous P2P connect request with the same incoming probe key",0x4a
                  );
        pOVar3 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      LOCK();
      paVar1 = &(pIVar4->SelfRefCount).RefCount;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
      UNLOCK();
      return;
    }
    if (this->P2PSocketsInitialized == false) {
      initializeP2PSockets(this,startParams);
    }
    bVar7 = (startParams->PeerExternalAddress).impl_.data_.base.sa_family != 2;
    if (bVar7) {
      local_1d8.ipv6_address_.addr_.__in6_u._0_8_ =
           *(undefined8 *)((long)&(startParams->PeerExternalAddress).impl_.data_ + 8);
      local_1d8.ipv6_address_.addr_.__in6_u._8_8_ =
           *(undefined8 *)((long)&(startParams->PeerExternalAddress).impl_.data_ + 0x10);
      local_1d8.ipv6_address_.scope_id_ =
           (unsigned_long)(startParams->PeerExternalAddress).impl_.data_.v6.sin6_scope_id;
      local_1d8.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
    }
    else {
      local_1d8.ipv4_address_.addr_.s_addr =
           (in4_addr_type)(startParams->PeerExternalAddress).impl_.data_.v4.sin_addr.s_addr;
      local_1d8.ipv6_address_.scope_id_ = 0;
      local_1d8.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_1d8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    }
    local_1d8.type_ = (anon_enum_32)bVar7;
    asio::ip::address::to_string_abi_cxx11_((string *)local_218,&local_1d8);
    swap_bytes((startParams->PeerExternalAddress).impl_.data_.v4.sin_port);
    uVar5 = (uint)(startParams->EncryptionKey >> 0x20);
    if (startParams->WinTies != false) {
      uVar5 = (uint)startParams->EncryptionKey;
    }
    HexString_abi_cxx11_((string *)&local_1f8,(tonk *)(ulong)uVar5,value);
    if ((int)(this->Logger).ChannelMinLevel < 3) {
      local_1b8._0_8_ = (this->Logger).ChannelName;
      local_1b8._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,(this->Logger).Prefix._M_dataplus._M_p,
                 (this->Logger).Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"Server requesting that we P2P connect to ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,(char *)local_218._0_8_,local_218._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," - WinTies=",0xb);
      pcVar6 = "false";
      if ((ulong)startParams->WinTies != 0) {
        pcVar6 = "true";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,pcVar6,(ulong)startParams->WinTies ^ 5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," Interval=",10);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,". Waiting for probe key = ",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,(char *)local_1f8._M_allocated_capacity,local_1f8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,". Requesting ports from ",0x18);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      pOVar3 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    if ((char *)local_1f8._M_allocated_capacity != local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity);
    }
    if ((ErrorResult *)local_218._0_8_ != (ErrorResult *)(local_218 + 0x10)) {
      operator_delete((void *)local_218._0_8_);
    }
    this_00 = (Connection *)operator_new(0xc930,(nothrow_t *)&std::nothrow);
    if (this_00 != (Connection *)0x0) {
      Connection::Connection(this_00);
      local_1b8._0_8_ = &this->SelfRefCount;
      local_1b8._8_8_ = &this->MainSocket;
      local_1a8 = (RefCounter *)&(this->MainSocket).AddressMap;
      local_1a0 = &this->IdMap;
      local_190 = (ConnectionIdMap *)
                  (this->MappedPort).
                  super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      local_188 = (P2PConnectionKeyMap *)
                  (this->Context).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      pMStack_180 = (MappedPortLifetime *)
                    (this->Context).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      p_Var2 = (this->Context).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      local_168 = ZEXT816(0) << 0x20;
      local_178 = (element_type *)0x0;
      local_158 = 0;
      local_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
      local_198 = (ConnectionAddrMap *)&this->P2PKeyMap;
      local_150 = this;
      Connection::InitializeP2PConnection
                ((Connection *)local_218,(Dependencies *)this_00,(TonkSocketConfig *)local_1b8,
                 (int)this + 0x3800,(P2PConnectParams *)(ulong)rendezvousServerConnectionId);
      if (pMStack_180 != (MappedPortLifetime *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pMStack_180);
      }
      if ((ErrorResult *)local_218._0_8_ != (ErrorResult *)0x0) {
        (*(this_00->super_IConnection)._vptr_IConnection[1])(this_00);
      }
      Result::~Result((Result *)local_218);
      return;
    }
    if (4 < (int)(this->Logger).ChannelMinLevel) {
      return;
    }
    local_1b8._0_8_ = (this->Logger).ChannelName;
    local_1b8._8_4_ = Error;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,(this->Logger).Prefix._M_dataplus._M_p,
               (this->Logger).Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"OOM during new P2P connection",0x1d);
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_1b8);
  }
  else {
    if (3 < (int)(this->Logger).ChannelMinLevel) {
      return;
    }
    local_1b8._0_8_ = (this->Logger).ChannelName;
    local_1b8._8_4_ = Warning;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,(this->Logger).Prefix._M_dataplus._M_p,
               (this->Logger).Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"P2P connection aborted during shutdown",0x26);
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_1b8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void ApplicationSession::onP2PStartConnect(
    uint16_t myRendezvousVisibleSourcePort,
    uint32_t rendezvousServerConnectionId,
    const protocol::P2PConnectParams& startParams)
{
    if (SelfRefCount.IsShutdown())
    {
        Logger.Warning("P2P connection aborted during shutdown");
        return;
    }

    // Attempt to find a duplicate connection request
    IConnection* icon = P2PKeyMap.FindByKey(startParams.GetExpectedIncomingProbeKey());
    if (icon)
    {
        Logger.Warning("Ignoring simultaneous P2P connect request with the same incoming probe key");
        icon->SelfRefCount.DecrementReferences();
        return;
    }

    // Note that this function is called from the Asio green thread,
    // so the P2P sockets will only be initialized once
    if (!P2PSocketsInitialized) {
        initializeP2PSockets(startParams);
    }

    Logger.Info("Server requesting that we P2P connect to ",
        startParams.PeerExternalAddress.address().to_string(), ":", startParams.PeerExternalAddress.port(),
        " - WinTies=", startParams.WinTies, " Interval=",
        startParams.ProtocolRoundIntervalMsec, ". Waiting for probe key = ",
        HexString(startParams.GetExpectedIncomingProbeKey()),
        ". Requesting ports from ", myRendezvousVisibleSourcePort);

    Connection* connection = new(std::nothrow) Connection;

    if (!connection)
    {
        Logger.Error("OOM during new P2P connection");
        return;
    }

    Result result = connection->InitializeP2PConnection({
        &SelfRefCount,
        &MainSocket,
        &MainSocket.AddressMap,
        &IdMap,
        &P2PKeyMap,
        MappedPort.get(),
        Context,
        nullptr, // No FloodDetector backref for P2P connections
        UDPAddress(), // No Disconnect addr key
        this
    },
        &Config,
        rendezvousServerConnectionId,
        startParams);

    if (result.IsFail())
    {
        // Result already logged in InitializeP2PConnection()
        delete connection;
        connection = nullptr;
    }
}